

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ToStringInternal(JSContext *ctx,JSValue val,BOOL is_ToPropertyKey)

{
  int iVar1;
  undefined1 auVar2 [16];
  size_t buf_len;
  ulong uVar3;
  JSRefCountHeader *p;
  JSValueUnion JVar4;
  JSRefCountHeader *p_1;
  char *__s;
  JSValue JVar5;
  char buf [32];
  char acStack_b8 [136];
  
  JVar4 = val.u;
  __s = acStack_b8;
  switch((int)val.tag) {
  case 0:
    snprintf(acStack_b8,0x20,"%d",(ulong)JVar4.ptr & 0xffffffff);
    __s = acStack_b8;
    break;
  case 1:
    val = __JS_AtomToValue(ctx,3 - (val.u._0_4_ == 0),1);
    goto LAB_00120f0f;
  case 2:
    JVar4 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 1))->ptr;
    goto LAB_00120e43;
  case 3:
    JVar4 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x45))->ptr;
LAB_00120e43:
    *(int *)JVar4.ptr = *JVar4.ptr + 1;
    uVar3 = (ulong)JVar4.ptr & 0xffffffff00000000;
    val.tag = -7;
    val.u.ptr = JVar4.ptr;
    goto LAB_00120f90;
  case 6:
    uVar3 = val.tag & 0xffffffff;
LAB_00120f8e:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    val = (JSValue)(auVar2 << 0x40);
    uVar3 = 0;
    goto LAB_00120f90;
  case 7:
    js_dtoa1(acStack_b8,JVar4.float64,10,0,0);
    buf_len = strlen(acStack_b8);
    goto LAB_00120f07;
  case -8:
    if (is_ToPropertyKey == 0) {
      JS_ThrowTypeError(ctx,"cannot convert symbol to string");
      uVar3 = 6;
      goto LAB_00120f8e;
    }
  case -7:
    *(int *)JVar4.ptr = *JVar4.ptr + 1;
LAB_00120f66:
    uVar3 = (ulong)val.u.ptr & 0xffffffff00000000;
    goto LAB_00120f90;
  default:
    __s = "[unsupported type]";
    break;
  case -2:
    __s = "[function bytecode]";
    break;
  case -1:
    *(int *)JVar4.ptr = *JVar4.ptr + 1;
    JVar5 = JS_ToPrimitiveFree(ctx,val,0);
    val = JVar5;
    if ((((uint)JVar5.tag != 6) &&
        (val = JS_ToStringInternal(ctx,JVar5,is_ToPropertyKey), 0xfffffff4 < (uint)JVar5.tag)) &&
       (iVar1 = *JVar5.u.ptr, *(int *)JVar5.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar5);
    }
    goto LAB_00120f66;
  }
  buf_len = strlen(__s);
LAB_00120f07:
  val = JS_NewStringLen(ctx,__s,buf_len);
LAB_00120f0f:
  uVar3 = (ulong)val.u.ptr & 0xffffffff00000000;
LAB_00120f90:
  JVar5.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff | uVar3);
  JVar5.tag = val.tag;
  return JVar5;
}

Assistant:

JSValue JS_ToStringInternal(JSContext *ctx, JSValueConst val, BOOL is_ToPropertyKey)
{
    uint32_t tag;
    const char *str;
    char buf[32];

    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_STRING:
        return JS_DupValue(ctx, val);
    case JS_TAG_INT:
        snprintf(buf, sizeof(buf), "%d", JS_VALUE_GET_INT(val));
        str = buf;
        goto new_string;
    case JS_TAG_BOOL:
        return JS_AtomToString(ctx, JS_VALUE_GET_BOOL(val) ?
                          JS_ATOM_true : JS_ATOM_false);
    case JS_TAG_NULL:
        return JS_AtomToString(ctx, JS_ATOM_null);
    case JS_TAG_UNDEFINED:
        return JS_AtomToString(ctx, JS_ATOM_undefined);
    case JS_TAG_EXCEPTION:
        return JS_EXCEPTION;
    case JS_TAG_OBJECT:
        {
            JSValue val1, ret;
            val1 = JS_ToPrimitive(ctx, val, HINT_STRING);
            if (JS_IsException(val1))
                return val1;
            ret = JS_ToStringInternal(ctx, val1, is_ToPropertyKey);
            JS_FreeValue(ctx, val1);
            return ret;
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        str = "[function bytecode]";
        goto new_string;
    case JS_TAG_SYMBOL:
        if (is_ToPropertyKey) {
            return JS_DupValue(ctx, val);
        } else {
            return JS_ThrowTypeError(ctx, "cannot convert symbol to string");
        }
    case JS_TAG_FLOAT64:
        return js_dtoa(ctx, JS_VALUE_GET_FLOAT64(val), 10, 0,
                       JS_DTOA_VAR_FORMAT);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        return ctx->rt->bigint_ops.to_string(ctx, val);
    case JS_TAG_BIG_FLOAT:
        return ctx->rt->bigfloat_ops.to_string(ctx, val);
    case JS_TAG_BIG_DECIMAL:
        return ctx->rt->bigdecimal_ops.to_string(ctx, val);
#endif
    default:
        str = "[unsupported type]";
    new_string:
        return JS_NewString(ctx, str);
    }
}